

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::unroll_array_to_complex_store
          (CompilerGLSL *this,uint32_t target_id,uint32_t source_id)

{
  BaseType expr_type;
  Variant *pVVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  runtime_error *this_00;
  char (*ts_1) [4];
  string array_expr;
  SPIRType target_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t sStack_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  if ((this->backend).force_gl_in_out_block == true) {
    uVar4 = (ulong)target_id;
    if ((uVar4 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar4].type == TypeVariable)) {
      var = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar4);
    }
    else {
      var = (SPIRVariable *)0x0;
    }
    if ((((var != (SPIRVariable *)0x0) && (var->storage == Output)) &&
        (bVar2 = Compiler::is_builtin_variable(&this->super_Compiler,var), bVar2)) &&
       (uVar3 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn),
       uVar3 == 0x14)) {
      pSVar5 = Compiler::expression_type(&this->super_Compiler,source_id);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      if ((pSVar5->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar5->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
        convert_to_string<unsigned_int,_0>
                  ((string *)local_180,
                   (pSVar5->array).super_VectorView<unsigned_int>.ptr +
                   ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1));
        ::std::__cxx11::string::operator=((string *)&local_220,(string *)local_180);
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_);
        }
        if ((pSVar5->array).super_VectorView<unsigned_int>.ptr
            [(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1] == 0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (this_00,"Cannot unroll an array copy from unsized array.");
          *(undefined ***)this_00 = &PTR__runtime_error_0050aef0;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        to_expression_abi_cxx11_
                  ((string *)local_180,this,
                   (pSVar5->array).super_VectorView<unsigned_int>.ptr
                   [(pSVar5->array).super_VectorView<unsigned_int>.buffer_size - 1],true);
        ::std::__cxx11::string::operator=((string *)&local_220,(string *)local_180);
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_);
        }
      }
      local_180._8_4_ = 0;
      local_180._0_8_ = &PTR__SPIRType_0050af18;
      local_180._20_8_ = 0x100000000;
      local_180._28_4_ = 1;
      local_180._40_8_ = 0;
      local_180._48_8_ = 8;
      local_180._96_8_ = 0;
      local_180._104_8_ = 8;
      local_180._120_4_ = 0;
      local_180[0x7c] = false;
      local_180[0x7d] = false;
      local_180._128_4_ = Generic;
      local_180._136_8_ = local_180 + 0xa0;
      local_180._144_8_ = 0;
      local_180._152_8_ = 8;
      local_c0 = local_a8;
      sStack_b8 = 0;
      local_b0 = 8;
      local_68._M_buckets = &local_68._M_single_bucket;
      local_88._0_7_ = 0;
      local_88._7_4_ = 0;
      local_6c.id = 0;
      local_88._12_4_ = 0;
      local_88._16_4_ = ImageFormatUnknown;
      local_88._20_4_ = AccessQualifierReadOnly;
      local_88._24_4_ = 0;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_180._12_8_ = 0x700000015;
      local_180._32_8_ = local_180 + 0x38;
      local_180._88_8_ = local_180 + 0x70;
      statement<char_const(&)[25],std::__cxx11::string&,char_const(&)[8]>
                (this,(char (*) [25])"for (int i = 0; i < int(",&local_220,(char (*) [8])"); i++)");
      statement<char_const(&)[2]>(this,(char (*) [2])0x3f7378);
      this->indent = this->indent + 1;
      to_expression_abi_cxx11_(&local_1a0,this,target_id,true);
      expr_type = pSVar5->basetype;
      ts_1 = (char (*) [4])0x1;
      to_expression_abi_cxx11_(&local_200,this,source_id,true);
      join<std::__cxx11::string,char_const(&)[4]>
                (&local_1e0,(spirv_cross *)&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[i]",ts_1);
      bitcast_expression(&local_1c0,this,(SPIRType *)local_180,expr_type,&local_1e0);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,&local_1a0,(char (*) [7])"[i] = ",&local_1c0,(char (*) [2])0x414fcb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      end_scope(this);
      local_180._0_8_ = &PTR__SPIRType_0050af18;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      sStack_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_180._144_8_ = 0;
      if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
          (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
        free((void *)local_180._136_8_);
      }
      local_180._96_8_ = 0;
      if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
        free((void *)local_180._88_8_);
      }
      local_180._40_8_ = 0;
      if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
        free((void *)local_180._32_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::unroll_array_to_complex_store(uint32_t target_id, uint32_t source_id)
{
	if (!backend.force_gl_in_out_block)
		return false;
	// This path is only relevant for GL backends.

	auto *var = maybe_get<SPIRVariable>(target_id);
	if (!var || var->storage != StorageClassOutput)
		return false;

	if (!is_builtin_variable(*var) || BuiltIn(get_decoration(var->self, DecorationBuiltIn)) != BuiltInSampleMask)
		return false;

	auto &type = expression_type(source_id);
	string array_expr;
	if (type.array_size_literal.back())
	{
		array_expr = convert_to_string(type.array.back());
		if (type.array.back() == 0)
			SPIRV_CROSS_THROW("Cannot unroll an array copy from unsized array.");
	}
	else
		array_expr = to_expression(type.array.back());

	SPIRType target_type { OpTypeInt };
	target_type.basetype = SPIRType::Int;

	statement("for (int i = 0; i < int(", array_expr, "); i++)");
	begin_scope();
	statement(to_expression(target_id), "[i] = ",
	          bitcast_expression(target_type, type.basetype, join(to_expression(source_id), "[i]")),
	          ";");
	end_scope();

	return true;
}